

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

ssh_ttymodes *
read_ttymodes_from_packet(ssh_ttymodes *__return_storage_ptr__,BinarySource *bs,int ssh_version)

{
  byte bVar1;
  uint uVar2;
  unsigned_long uVar3;
  uint uVar4;
  
  memset(__return_storage_ptr__,0,0x50c);
  bVar1 = BinarySource_get_byte(bs->binarysource_);
  while (0x60 < (byte)(bVar1 + 0x60)) {
    uVar4 = (uint)bVar1;
    if (ssh_version != 1) {
      if (bVar1 == 0x80) {
        uVar4 = 0x100;
      }
      else if (bVar1 == 0x81) {
        uVar4 = 0x101;
      }
    }
    __return_storage_ptr__->have_mode[uVar4] = true;
    if ((ssh_version == 1) && (-1 < (char)bVar1)) {
      bVar1 = BinarySource_get_byte(bs->binarysource_);
      uVar2 = (uint)bVar1;
    }
    else {
      uVar3 = BinarySource_get_uint32(bs->binarysource_);
      uVar2 = (uint)uVar3;
    }
    __return_storage_ptr__->mode_val[uVar4] = uVar2;
    bVar1 = BinarySource_get_byte(bs->binarysource_);
  }
  return __return_storage_ptr__;
}

Assistant:

struct ssh_ttymodes read_ttymodes_from_packet(
    BinarySource *bs, int ssh_version)
{
    struct ssh_ttymodes modes;
    memset(&modes, 0, sizeof(modes));

    while (1) {
        unsigned real_opcode, our_opcode;

        real_opcode = get_byte(bs);
        if (real_opcode == TTYMODE_END_OF_LIST)
            break;
        if (real_opcode >= 160) {
            /*
             * RFC 4254 (and the SSH 1.5 spec): "Opcodes 160 to 255
             * are not yet defined, and cause parsing to stop (they
             * should only be used after any other data)."
             *
             * My interpretation of this is that if one of these
             * opcodes appears, it's not a parse _error_, but it is
             * something that we don't know how to parse even well
             * enough to step over it to find the next opcode, so we
             * stop parsing now and assume that the rest of the string
             * is composed entirely of things we don't understand and
             * (as usual for unsupported terminal modes) silently
             * ignore.
             */
            return modes;
        }

        our_opcode = our_ttymode_opcode(real_opcode, ssh_version);
        assert(our_opcode < TTYMODE_LIMIT);
        modes.have_mode[our_opcode] = true;

        if (ssh_version == 1 && real_opcode >= 1 && real_opcode <= 127)
            modes.mode_val[our_opcode] = get_byte(bs);
        else
            modes.mode_val[our_opcode] = get_uint32(bs);
    }

    return modes;
}